

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFlatImage.cpp
# Opt level: O3

void anon_unknown.dwarf_bd1b::verifyPixelsAreEqual<half>
               (FlatImageChannel *c1,FlatImageChannel *c2,int dx,int dy)

{
  float fVar1;
  int iVar2;
  int iVar3;
  ImageLevel *pIVar4;
  ImageChannel *this;
  ImageChannel *this_00;
  ArgExc *this_01;
  int iVar5;
  int y;
  int x;
  int iVar6;
  
  this = (ImageChannel *)
         __dynamic_cast(c1,&Imf_2_5::FlatImageChannel::typeinfo,
                        &Imf_2_5::TypedFlatImageChannel<half>::typeinfo,0);
  if (this != (ImageChannel *)0x0) {
    this_00 = (ImageChannel *)
              __dynamic_cast(c2,&Imf_2_5::FlatImageChannel::typeinfo,
                             &Imf_2_5::TypedFlatImageChannel<half>::typeinfo,0);
    if (this_00 != (ImageChannel *)0x0) {
      pIVar4 = (c1->super_ImageChannel)._level;
      y = (pIVar4->_dataWindow).min.y;
      iVar6 = (pIVar4->_dataWindow).max.y;
      if (y <= iVar6) {
        iVar2 = (c1->super_ImageChannel)._xSampling;
        iVar3 = (c1->super_ImageChannel)._ySampling;
        iVar5 = (pIVar4->_dataWindow).max.x;
        do {
          x = (pIVar4->_dataWindow).min.x;
          if (x <= iVar5) {
            do {
              Imf_2_5::ImageChannel::boundsCheck(this,x,y);
              fVar1 = half::_toFloat
                      [*(ushort *)
                        ((long)&(this[1]._level)->_vptr_ImageLevel +
                        (long)(x / this->_xSampling + (y / this->_ySampling) * this->_pixelsPerRow)
                        * 2)].f;
              iVar6 = dx + x;
              Imf_2_5::ImageChannel::boundsCheck(this_00,iVar6,y + dy);
              if ((fVar1 != half::_toFloat
                            [*(ushort *)
                              ((long)&(this_00[1]._level)->_vptr_ImageLevel +
                              (long)(iVar6 / this_00->_xSampling +
                                    ((y + dy) / this_00->_ySampling) * this_00->_pixelsPerRow) * 2)]
                            .f) ||
                 (NAN(fVar1) ||
                  NAN(half::_toFloat
                      [*(ushort *)
                        ((long)&(this_00[1]._level)->_vptr_ImageLevel +
                        (long)(iVar6 / this_00->_xSampling +
                              ((y + dy) / this_00->_ySampling) * this_00->_pixelsPerRow) * 2)].f)))
              {
                this_01 = (ArgExc *)
                          __cxa_allocate_exception
                                    (0x48,this_00[1]._level,
                                     (long)iVar6 % (long)this_00->_xSampling & 0xffffffff);
                Iex_2_5::ArgExc::ArgExc(this_01,"different pixel values");
                __cxa_throw(this_01,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
              }
              x = x + iVar2;
              iVar5 = (pIVar4->_dataWindow).max.x;
            } while (x <= iVar5);
            iVar6 = (pIVar4->_dataWindow).max.y;
          }
          y = y + iVar3;
        } while (y <= iVar6);
      }
      return;
    }
  }
  __cxa_bad_cast();
}

Assistant:

void
verifyPixelsAreEqual
    (const FlatImageChannel &c1,
     const FlatImageChannel &c2,
     int dx,
     int dy)
{
    const TypedFlatImageChannel<T> &tc1 =
        dynamic_cast <const TypedFlatImageChannel<T>&> (c1);

    const TypedFlatImageChannel<T> &tc2 =
        dynamic_cast <const TypedFlatImageChannel<T>&> (c2);

    const Box2i &dataWindow = c1.level().dataWindow();
    int xStep = c1.xSampling();
    int yStep = c1.ySampling();

    for (int y = dataWindow.min.y; y <= dataWindow.max.y; y += yStep)
        for (int x = dataWindow.min.x; x <= dataWindow.max.x; x += xStep)
            if (tc1.at (x, y) != tc2.at (x + dx, y + dy))
                throw ArgExc ("different pixel values");
}